

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

VmConstant * EvaluateModule(InstructionVMEvalContext *ctx,VmModule *module)

{
  VmFunction *function;
  Allocator *pAVar1;
  StackFrame **ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  VmConstant *pVVar5;
  uint uVar6;
  StackFrame *pSVar4;
  
  function = (module->functions).tail;
  ctx->hasError = false;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,0,0x1000);
  ctx->heapSize = ctx->heapSize + 0x1000;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x280);
  pSVar4 = (StackFrame *)CONCAT44(extraout_var,iVar3);
  pAVar1 = ctx->allocator;
  pSVar4->owner = function;
  (pSVar4->instructionValues).allocator = pAVar1;
  (pSVar4->instructionValues).data = (pSVar4->instructionValues).little;
  (pSVar4->instructionValues).count = 0;
  (pSVar4->instructionValues).max = 0x20;
  (pSVar4->allocas).functionOwner = function;
  (pSVar4->allocas).tag = "allocas";
  (pSVar4->allocas).index = 0;
  (pSVar4->allocas).data.allocator = pAVar1;
  (pSVar4->allocas).data.data = (pSVar4->allocas).data.little;
  (pSVar4->allocas).data.count = 0;
  (pSVar4->allocas).data.max = 0x80;
  (pSVar4->allocas).expired = false;
  (pSVar4->stack).functionOwner = function;
  (pSVar4->stack).tag = "stack";
  (pSVar4->stack).index = 0;
  (pSVar4->stack).data.allocator = pAVar1;
  (pSVar4->stack).data.data = (pSVar4->stack).data.little;
  (pSVar4->stack).data.count = 0;
  (pSVar4->stack).data.max = 0x80;
  (pSVar4->stack).expired = false;
  ctx->globalFrame = pSVar4;
  uVar6 = (ctx->stackFrames).count;
  if (uVar6 == (ctx->stackFrames).max) {
    SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::grow(&ctx->stackFrames,uVar6);
  }
  ppSVar2 = (ctx->stackFrames).data;
  if (ppSVar2 == (StackFrame **)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<InstructionVMEvalContext::StackFrame *, 32>::push_back(const T &) [T = InstructionVMEvalContext::StackFrame *, N = 32]"
                 );
  }
  pSVar4 = ctx->globalFrame;
  uVar6 = (ctx->stackFrames).count;
  (ctx->stackFrames).count = uVar6 + 1;
  ppSVar2[uVar6] = pSVar4;
  pVVar5 = EvaluateFunction(ctx,function);
  if (ctx->hasError == false) {
    uVar6 = (ctx->stackFrames).count;
    if (uVar6 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x183,
                    "void SmallArray<InstructionVMEvalContext::StackFrame *, 32>::pop_back() [T = InstructionVMEvalContext::StackFrame *, N = 32]"
                   );
    }
    uVar6 = uVar6 - 1;
    (ctx->stackFrames).count = uVar6;
    if (uVar6 != 0) {
      __assert_fail("ctx.stackFrames.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0xa0a,"VmConstant *EvaluateModule(InstructionVMEvalContext &, VmModule *)");
    }
  }
  else {
    pVVar5 = (VmConstant *)0x0;
  }
  return pVVar5;
}

Assistant:

VmConstant* EvaluateModule(InstructionVMEvalContext &ctx, VmModule *module)
{
	VmFunction *global = module->functions.tail;

	ctx.hasError = false;

	ctx.heap.Reserve(ctx, 0, 4096);
	ctx.heapSize += 4096;

	ctx.globalFrame = new (ctx.get<InstructionVMEvalContext::StackFrame>()) InstructionVMEvalContext::StackFrame(ctx.allocator, global);
	ctx.stackFrames.push_back(ctx.globalFrame);

	VmConstant *result = EvaluateFunction(ctx, global);

	if(ctx.hasError)
		return NULL;

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return result;
}